

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlRegPrintAtomType(FILE *output,xmlRegAtomType type)

{
  size_t __size;
  char *__ptr;
  
  switch(type) {
  case XML_REGEXP_LETTER:
    __ptr = "LETTER ";
    goto LAB_001aa97e;
  case XML_REGEXP_LETTER_UPPERCASE:
    __ptr = "LETTER_UPPERCASE ";
    goto LAB_001aa83d;
  case XML_REGEXP_LETTER_LOWERCASE:
    __ptr = "LETTER_LOWERCASE ";
    goto LAB_001aa83d;
  case XML_REGEXP_LETTER_TITLECASE:
    __ptr = "LETTER_TITLECASE ";
LAB_001aa83d:
    __size = 0x11;
    goto LAB_001aa983;
  case XML_REGEXP_LETTER_MODIFIER:
    __ptr = "LETTER_MODIFIER ";
    break;
  case XML_REGEXP_LETTER_OTHERS:
    __ptr = "LETTER_OTHERS ";
    goto LAB_001aa934;
  case XML_REGEXP_MARK:
    __ptr = "MARK ";
    __size = 5;
    goto LAB_001aa983;
  case XML_REGEXP_MARK_NONSPACING:
    __ptr = "MARK_NONSPACING ";
    break;
  case XML_REGEXP_MARK_SPACECOMBINING:
    __ptr = "MARK_SPACECOMBINING ";
    __size = 0x14;
    goto LAB_001aa983;
  case XML_REGEXP_MARK_ENCLOSING:
    __ptr = "MARK_ENCLOSING ";
    goto LAB_001aa878;
  case XML_REGEXP_NUMBER:
    __ptr = "NUMBER ";
    goto LAB_001aa97e;
  case XML_REGEXP_NUMBER_DECIMAL:
    __ptr = "NUMBER_DECIMAL ";
    goto LAB_001aa878;
  case XML_REGEXP_NUMBER_LETTER:
    __ptr = "NUMBER_LETTER ";
    goto LAB_001aa934;
  case XML_REGEXP_NUMBER_OTHERS:
    __ptr = "NUMBER_OTHERS ";
    goto LAB_001aa934;
  case XML_REGEXP_PUNCT:
    __ptr = "PUNCT ";
    goto LAB_001aa942;
  case XML_REGEXP_PUNCT_CONNECTOR:
    __ptr = "PUNCT_CONNECTOR ";
    break;
  case XML_REGEXP_PUNCT_DASH:
    __ptr = "PUNCT_DASH ";
    goto LAB_001aa8ec;
  case XML_REGEXP_PUNCT_OPEN:
    __ptr = "PUNCT_OPEN ";
    goto LAB_001aa8ec;
  case XML_REGEXP_PUNCT_CLOSE:
    __ptr = "PUNCT_CLOSE ";
    goto LAB_001aa959;
  case XML_REGEXP_PUNCT_INITQUOTE:
    __ptr = "PUNCT_INITQUOTE ";
    break;
  case XML_REGEXP_PUNCT_FINQUOTE:
    __ptr = "PUNCT_FINQUOTE ";
LAB_001aa878:
    __size = 0xf;
    goto LAB_001aa983;
  case XML_REGEXP_PUNCT_OTHERS:
    __ptr = "PUNCT_OTHERS ";
    goto LAB_001aa895;
  case XML_REGEXP_SEPAR:
    __ptr = "SEPAR ";
    goto LAB_001aa942;
  case XML_REGEXP_SEPAR_SPACE:
    __ptr = "SEPAR_SPACE ";
    goto LAB_001aa959;
  case XML_REGEXP_SEPAR_LINE:
    __ptr = "SEPAR_LINE ";
    goto LAB_001aa8ec;
  case XML_REGEXP_SEPAR_PARA:
    __ptr = "SEPAR_PARA ";
LAB_001aa8ec:
    __size = 0xb;
    goto LAB_001aa983;
  case XML_REGEXP_SYMBOL:
    __ptr = "SYMBOL ";
LAB_001aa97e:
    __size = 7;
    goto LAB_001aa983;
  case XML_REGEXP_SYMBOL_MATH:
    __ptr = "SYMBOL_MATH ";
LAB_001aa959:
    __size = 0xc;
    goto LAB_001aa983;
  case XML_REGEXP_SYMBOL_CURRENCY:
    __ptr = "SYMBOL_CURRENCY ";
    break;
  case XML_REGEXP_SYMBOL_MODIFIER:
    __ptr = "SYMBOL_MODIFIER ";
    break;
  case XML_REGEXP_SYMBOL_OTHERS:
    __ptr = "SYMBOL_OTHERS ";
    goto LAB_001aa934;
  case XML_REGEXP_OTHER:
    __ptr = "OTHER ";
    goto LAB_001aa942;
  case XML_REGEXP_OTHER_CONTROL:
    __ptr = "OTHER_CONTROL ";
    goto LAB_001aa934;
  case XML_REGEXP_OTHER_FORMAT:
    __ptr = "OTHER_FORMAT ";
LAB_001aa895:
    __size = 0xd;
    goto LAB_001aa983;
  case XML_REGEXP_OTHER_PRIVATE:
    __ptr = "OTHER_PRIVATE ";
LAB_001aa934:
    __size = 0xe;
    goto LAB_001aa983;
  case XML_REGEXP_OTHER_NA:
    __ptr = "OTHER_NA ";
    goto LAB_001aa91d;
  case XML_REGEXP_BLOCK_NAME:
    __ptr = "BLOCK ";
LAB_001aa942:
    __size = 6;
    goto LAB_001aa983;
  default:
    switch(type) {
    case XML_REGEXP_EPSILON:
      __ptr = "epsilon ";
      goto LAB_001aa8c3;
    case XML_REGEXP_CHARVAL:
      __ptr = "charval ";
      goto LAB_001aa8c3;
    case XML_REGEXP_RANGES:
      __ptr = "ranges ";
      goto LAB_001aa97e;
    case XML_REGEXP_SUBREG:
      __ptr = "subexpr ";
      goto LAB_001aa8c3;
    case XML_REGEXP_STRING:
      __ptr = "string ";
      goto LAB_001aa97e;
    case XML_REGEXP_ANYCHAR:
      __ptr = "anychar ";
      goto LAB_001aa8c3;
    case XML_REGEXP_ANYSPACE:
      __ptr = "anyspace ";
      break;
    case XML_REGEXP_NOTSPACE:
      __ptr = "notspace ";
      break;
    case XML_REGEXP_INITNAME:
      __ptr = "initname ";
      break;
    case XML_REGEXP_NOTINITNAME:
      __ptr = "notinitname ";
      goto LAB_001aa959;
    case XML_REGEXP_NAMECHAR:
      __ptr = "namechar ";
      break;
    case XML_REGEXP_NOTNAMECHAR:
      __ptr = "notnamechar ";
      goto LAB_001aa959;
    case XML_REGEXP_DECIMAL:
      __ptr = "decimal ";
LAB_001aa8c3:
      __size = 8;
      goto LAB_001aa983;
    case XML_REGEXP_NOTDECIMAL:
      __ptr = "notdecimal ";
      goto LAB_001aa8ec;
    case XML_REGEXP_REALCHAR:
      __ptr = "realchar ";
      break;
    case XML_REGEXP_NOTREALCHAR:
      __ptr = "notrealchar ";
      goto LAB_001aa959;
    default:
      return;
    }
LAB_001aa91d:
    __size = 9;
    goto LAB_001aa983;
  }
  __size = 0x10;
LAB_001aa983:
  fwrite(__ptr,__size,1,(FILE *)output);
  return;
}

Assistant:

static void
xmlRegPrintAtomType(FILE *output, xmlRegAtomType type) {
    switch (type) {
        case XML_REGEXP_EPSILON:
	    fprintf(output, "epsilon "); break;
        case XML_REGEXP_CHARVAL:
	    fprintf(output, "charval "); break;
        case XML_REGEXP_RANGES:
	    fprintf(output, "ranges "); break;
        case XML_REGEXP_SUBREG:
	    fprintf(output, "subexpr "); break;
        case XML_REGEXP_STRING:
	    fprintf(output, "string "); break;
        case XML_REGEXP_ANYCHAR:
	    fprintf(output, "anychar "); break;
        case XML_REGEXP_ANYSPACE:
	    fprintf(output, "anyspace "); break;
        case XML_REGEXP_NOTSPACE:
	    fprintf(output, "notspace "); break;
        case XML_REGEXP_INITNAME:
	    fprintf(output, "initname "); break;
        case XML_REGEXP_NOTINITNAME:
	    fprintf(output, "notinitname "); break;
        case XML_REGEXP_NAMECHAR:
	    fprintf(output, "namechar "); break;
        case XML_REGEXP_NOTNAMECHAR:
	    fprintf(output, "notnamechar "); break;
        case XML_REGEXP_DECIMAL:
	    fprintf(output, "decimal "); break;
        case XML_REGEXP_NOTDECIMAL:
	    fprintf(output, "notdecimal "); break;
        case XML_REGEXP_REALCHAR:
	    fprintf(output, "realchar "); break;
        case XML_REGEXP_NOTREALCHAR:
	    fprintf(output, "notrealchar "); break;
        case XML_REGEXP_LETTER:
            fprintf(output, "LETTER "); break;
        case XML_REGEXP_LETTER_UPPERCASE:
            fprintf(output, "LETTER_UPPERCASE "); break;
        case XML_REGEXP_LETTER_LOWERCASE:
            fprintf(output, "LETTER_LOWERCASE "); break;
        case XML_REGEXP_LETTER_TITLECASE:
            fprintf(output, "LETTER_TITLECASE "); break;
        case XML_REGEXP_LETTER_MODIFIER:
            fprintf(output, "LETTER_MODIFIER "); break;
        case XML_REGEXP_LETTER_OTHERS:
            fprintf(output, "LETTER_OTHERS "); break;
        case XML_REGEXP_MARK:
            fprintf(output, "MARK "); break;
        case XML_REGEXP_MARK_NONSPACING:
            fprintf(output, "MARK_NONSPACING "); break;
        case XML_REGEXP_MARK_SPACECOMBINING:
            fprintf(output, "MARK_SPACECOMBINING "); break;
        case XML_REGEXP_MARK_ENCLOSING:
            fprintf(output, "MARK_ENCLOSING "); break;
        case XML_REGEXP_NUMBER:
            fprintf(output, "NUMBER "); break;
        case XML_REGEXP_NUMBER_DECIMAL:
            fprintf(output, "NUMBER_DECIMAL "); break;
        case XML_REGEXP_NUMBER_LETTER:
            fprintf(output, "NUMBER_LETTER "); break;
        case XML_REGEXP_NUMBER_OTHERS:
            fprintf(output, "NUMBER_OTHERS "); break;
        case XML_REGEXP_PUNCT:
            fprintf(output, "PUNCT "); break;
        case XML_REGEXP_PUNCT_CONNECTOR:
            fprintf(output, "PUNCT_CONNECTOR "); break;
        case XML_REGEXP_PUNCT_DASH:
            fprintf(output, "PUNCT_DASH "); break;
        case XML_REGEXP_PUNCT_OPEN:
            fprintf(output, "PUNCT_OPEN "); break;
        case XML_REGEXP_PUNCT_CLOSE:
            fprintf(output, "PUNCT_CLOSE "); break;
        case XML_REGEXP_PUNCT_INITQUOTE:
            fprintf(output, "PUNCT_INITQUOTE "); break;
        case XML_REGEXP_PUNCT_FINQUOTE:
            fprintf(output, "PUNCT_FINQUOTE "); break;
        case XML_REGEXP_PUNCT_OTHERS:
            fprintf(output, "PUNCT_OTHERS "); break;
        case XML_REGEXP_SEPAR:
            fprintf(output, "SEPAR "); break;
        case XML_REGEXP_SEPAR_SPACE:
            fprintf(output, "SEPAR_SPACE "); break;
        case XML_REGEXP_SEPAR_LINE:
            fprintf(output, "SEPAR_LINE "); break;
        case XML_REGEXP_SEPAR_PARA:
            fprintf(output, "SEPAR_PARA "); break;
        case XML_REGEXP_SYMBOL:
            fprintf(output, "SYMBOL "); break;
        case XML_REGEXP_SYMBOL_MATH:
            fprintf(output, "SYMBOL_MATH "); break;
        case XML_REGEXP_SYMBOL_CURRENCY:
            fprintf(output, "SYMBOL_CURRENCY "); break;
        case XML_REGEXP_SYMBOL_MODIFIER:
            fprintf(output, "SYMBOL_MODIFIER "); break;
        case XML_REGEXP_SYMBOL_OTHERS:
            fprintf(output, "SYMBOL_OTHERS "); break;
        case XML_REGEXP_OTHER:
            fprintf(output, "OTHER "); break;
        case XML_REGEXP_OTHER_CONTROL:
            fprintf(output, "OTHER_CONTROL "); break;
        case XML_REGEXP_OTHER_FORMAT:
            fprintf(output, "OTHER_FORMAT "); break;
        case XML_REGEXP_OTHER_PRIVATE:
            fprintf(output, "OTHER_PRIVATE "); break;
        case XML_REGEXP_OTHER_NA:
            fprintf(output, "OTHER_NA "); break;
        case XML_REGEXP_BLOCK_NAME:
	    fprintf(output, "BLOCK "); break;
    }
}